

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayhelper.cpp
# Opt level: O0

void ArrayHelper::shuffleTrainingData(double **inputs,double **outputs,size_t trainingCount)

{
  double *pdVar1;
  int iVar2;
  size_t sVar3;
  double *address;
  size_t randIndex;
  size_t i;
  size_t trainingCount_local;
  double **outputs_local;
  double **inputs_local;
  
  for (randIndex = 0; randIndex < trainingCount; randIndex = randIndex + 1) {
    iVar2 = rand();
    sVar3 = randIndex + (ulong)(long)iVar2 % (trainingCount - randIndex);
    if (sVar3 != randIndex) {
      pdVar1 = inputs[randIndex];
      inputs[randIndex] = inputs[sVar3];
      inputs[sVar3] = pdVar1;
      pdVar1 = outputs[randIndex];
      outputs[randIndex] = outputs[sVar3];
      outputs[sVar3] = pdVar1;
    }
  }
  return;
}

Assistant:

void ArrayHelper::shuffleTrainingData(double** inputs, double** outputs, size_t trainingCount) {
	for (size_t i = 0; i < trainingCount; ++i) {
		size_t randIndex = i + std::rand() % (trainingCount - i);

		if (randIndex != i) {
			double* address = inputs[i];
			inputs[i] = inputs[randIndex];
			inputs[randIndex] = address;

			address = outputs[i];
			outputs[i] = outputs[randIndex];
			outputs[randIndex] = address;
		}
	}
}